

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::exportTable(RBBITableBuilder *this,void *where)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  void *pvVar4;
  undefined2 *puVar5;
  RBBIStateTableRow *row;
  RBBIStateDescriptor *sd;
  int32_t local_28;
  int32_t catCount;
  int col;
  uint32_t state;
  RBBIStateTable *table;
  void *where_local;
  RBBITableBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*this->fStatus);
  if ((UVar1 == '\0') && (*this->fTree != (RBBINode *)0x0)) {
    iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
    if ((iVar2 < 0x8000) && (iVar3 = UVector::size(this->fDStates), iVar3 < 0x8000)) {
      *(int32_t *)((long)where + 4) = iVar2 * 2 + 8;
      iVar3 = UVector::size(this->fDStates);
      *(int32_t *)where = iVar3;
      *(undefined4 *)((long)where + 8) = 0;
      if (this->fRB->fLookAheadHardBreak != '\0') {
        *(uint *)((long)where + 8) = *(uint *)((long)where + 8) | 1;
      }
      UVar1 = RBBISetBuilder::sawBOF(this->fRB->fSetBuilder);
      if (UVar1 != '\0') {
        *(uint *)((long)where + 8) = *(uint *)((long)where + 8) | 2;
      }
      *(undefined4 *)((long)where + 0xc) = 0;
      for (catCount = 0; (uint)catCount < *where; catCount = catCount + 1) {
        pvVar4 = UVector::elementAt(this->fDStates,catCount);
        puVar5 = (undefined2 *)
                 ((long)where + (ulong)(uint)(catCount * *(int *)((long)where + 4)) + 0x10);
        *puVar5 = (short)*(undefined4 *)((long)pvVar4 + 4);
        puVar5[1] = (short)*(undefined4 *)((long)pvVar4 + 8);
        puVar5[2] = (short)*(undefined4 *)((long)pvVar4 + 0x18);
        for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
          iVar3 = UVector32::elementAti(*(UVector32 **)((long)pvVar4 + 0x28),local_28);
          puVar5[(long)local_28 + 4] = (short)iVar3;
        }
      }
    }
    else {
      *this->fStatus = U_BRK_ERROR_START;
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::exportTable(void *where) {
    RBBIStateTable    *table = (RBBIStateTable *)where;
    uint32_t           state;
    int                col;

    if (U_FAILURE(*fStatus) || fTree == NULL) {
        return;
    }

    int32_t catCount = fRB->fSetBuilder->getNumCharCategories();
    if (catCount > 0x7fff ||
        fDStates->size() > 0x7fff) {
        *fStatus = U_BRK_INTERNAL_ERROR;
        return;
    }

    table->fRowLen    = offsetof(RBBIStateTableRow, fNextState) + sizeof(uint16_t) * catCount;
    table->fNumStates = fDStates->size();
    table->fFlags     = 0;
    if (fRB->fLookAheadHardBreak) {
        table->fFlags  |= RBBI_LOOKAHEAD_HARD_BREAK;
    }
    if (fRB->fSetBuilder->sawBOF()) {
        table->fFlags  |= RBBI_BOF_REQUIRED;
    }
    table->fReserved  = 0;

    for (state=0; state<table->fNumStates; state++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        RBBIStateTableRow   *row = (RBBIStateTableRow *)(table->fTableData + state*table->fRowLen);
        U_ASSERT (-32768 < sd->fAccepting && sd->fAccepting <= 32767);
        U_ASSERT (-32768 < sd->fLookAhead && sd->fLookAhead <= 32767);
        row->fAccepting = (int16_t)sd->fAccepting;
        row->fLookAhead = (int16_t)sd->fLookAhead;
        row->fTagIdx    = (int16_t)sd->fTagsIdx;
        for (col=0; col<catCount; col++) {
            row->fNextState[col] = (uint16_t)sd->fDtran->elementAti(col);
        }
    }
}